

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O1

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleStructArrayCase::BlockSingleStructArrayCase
          (BlockSingleStructArrayCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructType *this_02;
  BufferBlock *this_03;
  VarType local_a0;
  BufferVar local_88;
  VarType local_48;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,"",layoutFlags,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00d5f5e0;
  this->m_layoutFlags = (deUint32)description;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_88,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_88,&local_a0,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType((VarType *)&local_88,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  this_03 = ShaderInterface::allocBlock(this_00,"Block");
  glu::VarType::VarType(&local_a0,TYPE_UINT,PRECISION_LOWP);
  BufferVar::BufferVar(&local_88,"u",&local_a0,0);
  this_01 = &this_03->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  paVar1 = &local_88.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_48,this_02);
  glu::VarType::VarType(&local_a0,&local_48,3);
  BufferVar::BufferVar(&local_88,"s",&local_a0,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  glu::VarType::~VarType(&local_48);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_88,"v",&local_a0,0x400);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  this_03->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&this_03->m_instanceName,0,(char *)(this_03->m_instanceName)._M_string_length,
               0xb77d96);
    BufferBlock::setArraySize(this_03,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleStructArrayCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), 3), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}